

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.h
# Opt level: O1

void __thiscall pbrt::TransformCache::TransformCache(TransformCache *this)

{
  list<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
  *plVar1;
  memory_resource *pmVar2;
  
  pmVar2 = gpuMemoryAllocator;
  if (*(char *)(Options + 0xf) != '\x01') {
    pmVar2 = pstd::pmr::new_delete_resource();
  }
  (this->bufferResource).super_memory_resource._vptr_memory_resource =
       (_func_int **)&PTR__monotonic_buffer_resource_0300a540;
  (this->bufferResource).upstreamResource = pmVar2;
  (this->bufferResource).blockSize = 0x40000;
  plVar1 = &(this->bufferResource).usedBlocks;
  (this->bufferResource).currentBlock.ptr = (void *)0x0;
  (this->bufferResource).currentBlock.size = 0;
  (this->bufferResource).currentBlockPos = 0;
  (this->bufferResource).usedBlocks.
  super__List_base<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)plVar1;
  (this->bufferResource).usedBlocks.
  super__List_base<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)plVar1;
  (this->bufferResource).usedBlocks.
  super__List_base<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
  ._M_impl._M_node._M_size = 0;
  plVar1 = &(this->bufferResource).availableBlocks;
  (this->bufferResource).availableBlocks.
  super__List_base<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)plVar1;
  (this->bufferResource).availableBlocks.
  super__List_base<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)plVar1;
  (this->bufferResource).availableBlocks.
  super__List_base<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
  ._M_impl._M_node._M_size = 0;
  (this->alloc).memoryResource = (memory_resource *)this;
  (this->hashTable)._M_h._M_buckets = &(this->hashTable)._M_h._M_single_bucket;
  (this->hashTable)._M_h._M_bucket_count = 1;
  (this->hashTable)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->hashTable)._M_h._M_element_count = 0;
  (this->hashTable)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->hashTable)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->hashTable)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  return;
}

Assistant:

TransformCache()
        : bufferResource(Options->useGPU ? gpuMemoryAllocator.resource()
                                         : Allocator().resource()),
          alloc(&bufferResource) {}